

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::Image::CreateImageGLES2::CreateImageGLES2
          (CreateImageGLES2 *this,EglTestContext *eglTestCtx,EGLint target,GLenum internalFormat,
          GLenum format,GLenum type,bool useTexLevel0)

{
  long *plVar1;
  long *plVar2;
  size_type *psVar3;
  string local_f8;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78 [2];
  long local_68 [2];
  EglTestContext *local_58;
  string local_50;
  
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"create_image_gles2_","");
  getTargetName(target);
  plVar1 = (long *)std::__cxx11::string::append((char *)local_78);
  local_d8 = &local_c8;
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_c8 = *plVar2;
    lStack_c0 = plVar1[3];
  }
  else {
    local_c8 = *plVar2;
    local_d8 = (long *)*plVar1;
  }
  local_d0 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_b8 = &local_a8;
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_a8 = *plVar2;
    lStack_a0 = plVar1[3];
  }
  else {
    local_a8 = *plVar2;
    local_b8 = (long *)*plVar1;
  }
  local_b0 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_58 = eglTestCtx;
  getStorageName(internalFormat);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_b8);
  local_98 = &local_88;
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_88 = *plVar2;
    lStack_80 = plVar1[3];
  }
  else {
    local_88 = *plVar2;
    local_98 = (long *)*plVar1;
  }
  local_90 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_98);
  psVar3 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_f8.field_2._M_allocated_capacity = *psVar3;
    local_f8.field_2._8_4_ = (undefined4)plVar1[3];
    local_f8.field_2._12_4_ = *(undefined4 *)((long)plVar1 + 0x1c);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  }
  else {
    local_f8.field_2._M_allocated_capacity = *psVar3;
    local_f8._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_f8._M_string_length = plVar1[1];
  *plVar1 = (long)psVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Create EGLImage from GLES2 object","");
  ImageTestCase::ImageTestCase(&this->super_ImageTestCase,local_58,(ApiType)0x2,&local_f8,&local_50)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  (this->super_ImageTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__CreateImageGLES2_02114170;
  getImageSource((MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
                  *)&local_f8,this,target,internalFormat,format,type,useTexLevel0);
  (this->m_source).
  super_UniqueBase<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
  .m_data.ptr = (ImageSource *)local_f8._M_dataplus._M_p;
  this->m_internalFormat = internalFormat;
  return;
}

Assistant:

CreateImageGLES2 (EglTestContext& eglTestCtx, EGLint target, GLenum internalFormat, GLenum format, GLenum type, bool useTexLevel0 = false)
		: ImageTestCase		(eglTestCtx, ApiType::es(2, 0), string("create_image_gles2_") + getTargetName(target) + "_" + getStorageName(internalFormat) + (useTexLevel0 ? "_level0_only" : ""), "Create EGLImage from GLES2 object")
		, m_source			(getImageSource(target, internalFormat, format, type, useTexLevel0))
		, m_internalFormat	(internalFormat)
	{
	}